

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O0

void Q_SetName(QMatrix *Q,char *Name)

{
  LASErrIdType LVar1;
  size_t sVar2;
  char *pcVar3;
  char *Name_local;
  QMatrix *Q_local;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    free(Q->Name);
    sVar2 = strlen(Name);
    pcVar3 = (char *)malloc(sVar2 + 1);
    Q->Name = pcVar3;
    if (Q->Name == (char *)0x0) {
      LASError(LASMemAllocErr,"Q_SetName",Name,(char *)0x0,(char *)0x0);
    }
    else {
      strcpy(Q->Name,Name);
    }
  }
  return;
}

Assistant:

void Q_SetName(QMatrix *Q, char *Name)
/* (re)set name of the matrix Q */
{
    if (LASResult() == LASOK) {
        free(Q->Name);
        Q->Name = (char *)malloc((strlen(Name) + 1) * sizeof(char));
        if (Q->Name != NULL)
            strcpy(Q->Name, Name);
        else
            LASError(LASMemAllocErr, "Q_SetName", Name, NULL, NULL);
    }
}